

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O2

int Lodtalk::Behavior::stBasicNewSize(InterpreterProxy *interpreter)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_t indexableSize;
  Object *pOVar3;
  Oop size;
  anon_union_8_4_0eb573b0_for_Oop_0 local_28;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) == 1) {
    local_28._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
    local_28.uintValue._4_4_ = extraout_var_00;
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
    iVar2 = (**interpreter->_vptr_InterpreterProxy)(interpreter);
    indexableSize = Oop::decodeSmallInteger((Oop *)&local_28);
    pOVar3 = basicNativeNew((Behavior *)CONCAT44(extraout_var_01,iVar1),
                            (VMContext *)CONCAT44(extraout_var_02,iVar2),indexableSize);
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x17])(interpreter,pOVar3);
    return iVar1;
  }
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
  return iVar1;
}

Assistant:

int Behavior::stBasicNewSize(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();

    Oop size = interpreter->getTemporary(0);
    auto self = reinterpret_cast<Behavior*> (interpreter->getReceiver().pointer);
    return interpreter->returnOop(Oop::fromPointer(self->basicNativeNew(interpreter->getContext(), size.decodeSmallInteger())));
}